

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFont.cpp
# Opt level: O2

void __thiscall irr::gui::CGUIFont::setMaxHeight(CGUIFont *this)

{
  long lVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  int iVar5;
  
  if (this->SpriteBank != (IGUISpriteBank *)0x0) {
    this->MaxHeight = 0;
    iVar3 = (**this->SpriteBank->_vptr_IGUISpriteBank)();
    lVar1 = *(long *)CONCAT44(extraout_var,iVar3);
    lVar2 = ((long *)CONCAT44(extraout_var,iVar3))[1];
    iVar3 = this->MaxHeight;
    for (uVar4 = 0; (lVar2 - lVar1 & 0xffffffff0U) != uVar4; uVar4 = uVar4 + 0x10) {
      iVar5 = *(int *)(lVar1 + 0xc + uVar4) - *(int *)(lVar1 + 4 + uVar4);
      if (iVar3 < iVar5) {
        this->MaxHeight = iVar5;
        iVar3 = iVar5;
      }
    }
  }
  return;
}

Assistant:

void CGUIFont::setMaxHeight()
{
	if (!SpriteBank)
		return;

	MaxHeight = 0;

	core::array<core::rect<s32>> &p = SpriteBank->getPositions();

	for (u32 i = 0; i < p.size(); ++i) {
		const s32 t = p[i].getHeight();
		if (t > MaxHeight)
			MaxHeight = t;
	}
}